

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O3

UINT8 device_start_multipcm(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint *puVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  UINT8 UVar6;
  int iVar7;
  DEV_DATA DVar8;
  uint uVar9;
  INT32 *pIVar10;
  INT32 (*paIVar11) [256];
  long lVar12;
  MultiPCM *ptChip;
  int iVar13;
  int iVar14;
  ulong uVar15;
  INT32 (*paIVar16) [256];
  long lVar17;
  long lVar18;
  float fVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  
  DVar8.chipInf = calloc(1,0x22d8);
  if ((DEV_DATA *)DVar8.chipInf == (DEV_DATA *)0x0) {
    UVar6 = 0xff;
  }
  else {
    fVar19 = (float)cfg->clock / 180.0;
    *(float *)((long)DVar8.chipInf + 0x10bc) = fVar19;
    if (IsInit == '\0') {
      IsInit = '\x01';
      lVar18 = 0;
      lVar12 = 0;
      do {
        dVar2 = pow(10.0,(double)(((float)(int)lVar12 * -24.0 * 0.015625) / 20.0));
        uVar9 = 0x10;
        uVar15 = 0;
        lVar17 = lVar18;
        do {
          iVar7 = (int)uVar15;
          if (iVar7 == 8) {
            fVar32 = 0.0;
            fVar31 = 0.0;
          }
          else if (iVar7 == 0) {
            fVar31 = 1.0;
            fVar32 = 1.0;
          }
          else if (uVar15 < 8) {
            dVar3 = pow(10.0,(double)(((float)iVar7 * -12.0 * 0.25) / 20.0));
            fVar31 = 0.0;
            if (uVar15 != 7) {
              fVar31 = (float)dVar3;
            }
            fVar32 = 1.0;
          }
          else {
            dVar3 = pow(10.0,(double)(((float)(int)uVar9 * -12.0 * 0.25) / 20.0));
            fVar32 = 0.0;
            if ((~uVar9 & 7) != 0) {
              fVar32 = (float)dVar3;
            }
            fVar31 = 1.0;
          }
          *(int *)((long)left_pan_table + lVar17) =
               (int)(long)(fVar31 * (float)dVar2 * 0.25 * 4096.0);
          *(int *)((long)right_pan_table + lVar17) =
               (int)(long)(fVar32 * (float)dVar2 * 0.25 * 4096.0);
          uVar15 = uVar15 + 1;
          uVar9 = uVar9 - 1;
          lVar17 = lVar17 + 0x200;
        } while (uVar15 != 0x10);
        lVar12 = lVar12 + 1;
        lVar18 = lVar18 + 4;
      } while (lVar12 != 0x80);
      pIVar10 = linear_to_exp_volume;
      lVar12 = 0;
      do {
        dVar2 = pow(10.0,(double)(((float)(int)lVar12 * 96.0 * -0.0009765625 + 96.0) / -20.0));
        *pIVar10 = (INT32)(long)((float)dVar2 * 4096.0);
        lVar12 = lVar12 + 1;
        pIVar10 = pIVar10 + 1;
      } while (lVar12 != 0x400);
      iVar7 = 0xff;
      lVar12 = -0x200;
      lVar18 = 0;
      uVar15 = 0;
      do {
        iVar13 = (int)lVar12;
        if (uVar15 < 0x40) {
          iVar13 = iVar13 + 0x280;
LAB_001647c1:
          *(int *)((long)pitch_table + lVar18) = iVar13;
          *(int *)((long)amplitude_table + lVar18) = iVar7;
        }
        else {
          if (uVar15 < 0x80) {
            iVar13 = iVar7 + 0x80;
            goto LAB_001647c1;
          }
          iVar14 = iVar13;
          if (uVar15 < 0xc0) {
            iVar14 = iVar7;
          }
          *(int *)((long)pitch_table + lVar18) = iVar14 + 0x81;
          *(int *)((long)amplitude_table + lVar18) = iVar13 + 0x100;
        }
        uVar15 = uVar15 + 1;
        iVar7 = iVar7 + -2;
        lVar18 = lVar18 + 4;
        lVar12 = lVar12 + 2;
      } while (lVar12 != 0);
      paIVar11 = pitch_scale_tables;
      paIVar16 = amplitude_scale_tables;
      lVar12 = 0;
      do {
        fVar31 = PHASE_SCALE_LIMIT[lVar12];
        lVar18 = 0;
        do {
          dVar2 = exp2((double)(((float)((int)lVar18 + -0x80) * fVar31 * 0.0078125) / 1200.0));
          (*paIVar11)[lVar18] = (INT32)(long)((float)dVar2 * 256.0);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x100);
        fVar31 = AMPLITUDE_SCALE_LIMIT[lVar12];
        lVar18 = 0;
        do {
          dVar2 = pow(10.0,(double)(((float)(int)lVar18 * -fVar31 * 0.00390625) / 20.0));
          (*paIVar16)[lVar18] = (INT32)(long)((float)dVar2 * 256.0);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x100);
        lVar12 = lVar12 + 1;
        paIVar11 = paIVar11 + 1;
        paIVar16 = paIVar16 + 1;
      } while (lVar12 != 8);
    }
    uVar9 = 0;
    uVar20 = 1;
    uVar21 = 2;
    uVar22 = 3;
    lVar12 = 0x4b0;
    do {
      fVar31 = (((float)(uVar9 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uVar9 & 0xffff | 0x4b000000) + 1024.0) * fVar19 * 0.0009765625 * 4096.0;
      fVar32 = (((float)(uVar20 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uVar20 & 0xffff | 0x4b000000) + 1024.0) * fVar19 * 0.0009765625 * 4096.0;
      fVar33 = (((float)(uVar21 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uVar21 & 0xffff | 0x4b000000) + 1024.0) * fVar19 * 0.0009765625 * 4096.0;
      fVar34 = (((float)(uVar22 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uVar22 & 0xffff | 0x4b000000) + 1024.0) * fVar19 * 0.0009765625 * 4096.0;
      uVar27 = (uint)fVar31;
      uVar28 = (uint)fVar32;
      uVar29 = (uint)fVar33;
      uVar30 = (uint)fVar34;
      puVar1 = (uint *)((long)DVar8.chipInf + lVar12 * 4);
      *puVar1 = (int)(fVar31 - 2.1474836e+09) & (int)uVar27 >> 0x1f | uVar27;
      puVar1[1] = (int)(fVar32 - 2.1474836e+09) & (int)uVar28 >> 0x1f | uVar28;
      puVar1[2] = (int)(fVar33 - 2.1474836e+09) & (int)uVar29 >> 0x1f | uVar29;
      puVar1[3] = (int)(fVar34 - 2.1474836e+09) & (int)uVar30 >> 0x1f | uVar30;
      auVar5 = _DAT_0017c870;
      auVar4 = _DAT_0017a800;
      uVar9 = uVar9 + 4;
      uVar20 = uVar20 + 4;
      uVar21 = uVar21 + 4;
      uVar22 = uVar22 + 4;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x8b0);
    lVar12 = 0;
    do {
      dVar2 = BASE_TIMES[lVar12 + 4];
      dVar3 = BASE_TIMES[lVar12 + 5];
      auVar24._0_8_ = dVar2 * 44100.0;
      auVar24._8_8_ = dVar3 * 44100.0;
      auVar25 = divpd(auVar24,auVar4);
      auVar26._0_4_ = (float)auVar25._0_8_;
      auVar26._4_4_ = (float)auVar25._8_8_;
      auVar26._8_8_ = 0;
      auVar25 = divps(auVar5,auVar26);
      iVar7 = (int)auVar25._0_4_;
      iVar13 = (int)auVar25._4_4_;
      *(ulong *)((long)DVar8.chipInf + lVar12 * 4 + 0x10d0) =
           CONCAT44((int)(auVar25._4_4_ - 2.1474836e+09),(int)(auVar25._0_4_ - 2.1474836e+09)) &
           CONCAT44(iVar13 >> 0x1f,iVar7 >> 0x1f) | CONCAT44(iVar13,iVar7);
      auVar25._0_8_ = dVar2 * 14.32833 * 44100.0;
      auVar25._8_8_ = dVar3 * 14.32833 * 44100.0;
      auVar25 = divpd(auVar25,auVar4);
      auVar23._0_4_ = (float)auVar25._0_8_;
      auVar23._4_4_ = (float)auVar25._8_8_;
      auVar23._8_8_ = 0;
      auVar25 = divps(auVar5,auVar23);
      iVar7 = (int)auVar25._0_4_;
      iVar13 = (int)auVar25._4_4_;
      *(ulong *)((long)DVar8.chipInf + lVar12 * 4 + 0x11d0) =
           CONCAT44((int)(auVar25._4_4_ - 2.1474836e+09),(int)(auVar25._0_4_ - 2.1474836e+09)) &
           CONCAT44(iVar13 >> 0x1f,iVar7 >> 0x1f) | CONCAT44(iVar13,iVar7);
      lVar12 = lVar12 + 2;
    } while (lVar12 != 0x3c);
    ((DEV_DATA *)((long)DVar8.chipInf + 0x10c0))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar8.chipInf + 0x10c8))->chipInf = (void *)0x0;
    *(undefined4 *)((long)DVar8.chipInf + 0x11bc) = 0x4000000;
    ((DEV_DATA *)((long)DVar8.chipInf + 0x11c0))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar8.chipInf + 0x11c8))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar8.chipInf + 0x22c0))->chipInf = (void *)0x4cffffff68;
    UVar6 = '\0';
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x10b0))->chipInf = 0;
    *(undefined8 *)((long)DVar8.chipInf + 0x10b4) = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x98))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x130))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x1c8))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x260))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x2f8))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x390))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x428))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x4c0))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x558))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x5f0))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x688))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x720))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x7b8))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x850))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x8e8))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x980))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0xa18))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0xab0))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0xb48))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0xbe0))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0xc78))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0xd10))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0xda8))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0xe40))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0xed8))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0xf70))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x1008))->chipInf = 0;
    *(undefined1 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x10a0))->chipInf = 0;
    *(void **)DVar8.chipInf = DVar8.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar8.chipInf;
    retDevInf->sampleRate = (UINT32)(long)fVar19;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar6;
}

Assistant:

static UINT8 device_start_multipcm(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	MultiPCM *ptChip;
	INT32 i;

	ptChip = (MultiPCM *)calloc(1, sizeof(MultiPCM));
	if (ptChip == NULL)
		return 0xFF;
	
	ptChip->ROM = NULL;
	ptChip->ROMSize = 0x00;
	ptChip->ROMMask = 0x00;
	ptChip->rate = (float)cfg->clock / MULTIPCM_CLOCKDIV;

	if (! IsInit)
	{
		INT32 level;

		IsInit = 1;

		// Volume + pan table
		for (level = 0; level < 0x80; ++level)
		{
			const float vol_db = (float)level * (-24.0f) / 64.0f;
			const float total_level = powf(10.0f, vol_db / 20.0f) / 4.0f;
			INT32 pan;

			for (pan = 0; pan < 0x10; ++pan)
			{
				float pan_left, pan_right;
				if (pan == 0x8)
				{
					pan_left = 0.0;
					pan_right = 0.0;
				}
				else if (pan == 0x0)
				{
					pan_left = 1.0;
					pan_right = 1.0;
				}
				else if (pan & 0x8)
				{
					const INT32 inverted_pan = 0x10 - pan;
					const float pan_vol_db = (float)inverted_pan * (-12.0f) / 4.0f;

					pan_left = 1.0;
					pan_right = powf(10.0f, pan_vol_db / 20.0f);

					if ((inverted_pan & 0x7) == 7)
						pan_right = 0.0;
				}
				else
				{
					const float pan_vol_db = (float)pan * (-12.0f) / 4.0f;

					pan_left = powf(10.0f, pan_vol_db / 20.0f);
					pan_right = 1.0;

					if ((pan & 0x7) == 7)
						pan_left = 0.0;
				}

				left_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_left * total_level);
				right_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_right * total_level);
			}
		}

		// build the linear->exponential ramps
		for(i = 0; i < 0x400; ++i)
		{
			const float db = -(96.0f - (96.0f * (float)i / (float)0x400));
			const float exp_volume = powf(10.0f, db / 20.0f);
			linear_to_exp_volume[i] = value_to_fixed(TL_SHIFT, exp_volume);
		}

		lfo_init();
	}

	//Pitch steps
	for (i = 0; i < 0x400; ++i)
	{
		const float fcent = ptChip->rate * (1024.0f + (float)i) / 1024.0f;
		ptChip->freq_step_table[i] = value_to_fixed(TL_SHIFT, fcent);
	}

	// Envelope steps
	for (i = 4; i < 0x40; ++i)
	{
		// Times are based on 44100Hz clock, adjust to real chip clock
		ptChip->attack_step[i] = (float)(0x400 << EG_SHIFT) / (float)(BASE_TIMES[i] * 44100.0 / 1000.0);
		ptChip->decay_release_step[i] = (float)(0x400 << EG_SHIFT) / (float)(BASE_TIMES[i] * attack_rate_to_decay_rate * 44100.0 / 1000.0);
	}
	ptChip->attack_step[0] = ptChip->attack_step[1] = ptChip->attack_step[2] = ptChip->attack_step[3] = 0;
	ptChip->attack_step[0x3f] = 0x400 << EG_SHIFT;
	ptChip->decay_release_step[0] = ptChip->decay_release_step[1] = ptChip->decay_release_step[2] = ptChip->decay_release_step[3] = 0;

	// Total level interpolation steps
	ptChip->total_level_steps[0] = -(float)(0x80 << TL_SHIFT) / (78.2f * 44100.0f / 1000.0f); // lower
	ptChip->total_level_steps[1] = (float)(0x80 << TL_SHIFT) / (78.2f * 2 * 44100.0f / 1000.0f); // raise

	ptChip->sega_banking = 0;
	ptChip->bank0 = ptChip->bank1 = 0x000000;

	multipcm_set_mute_mask(ptChip, 0x00);

	ptChip->_devData.chipInf = ptChip;
	INIT_DEVINF(retDevInf, &ptChip->_devData, (UINT32)ptChip->rate, &devDef);

	return 0x00;
}